

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_1c0521f::HandleCompareCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pbVar1;
  pointer pbVar2;
  __type _Var3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  cmMakefile *this;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view value;
  string e;
  string e_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  pointer local_78;
  undefined8 local_70;
  undefined8 local_68;
  char *local_60;
  undefined8 local_58;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"sub-command COMPARE requires a mode to be specified.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_50.field_2._M_allocated_capacity = local_98.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) {
      return false;
    }
LAB_004abe7b:
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    return false;
  }
  __rhs = pbVar1 + 1;
  iVar5 = std::__cxx11::string::compare((char *)__rhs);
  if ((((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)__rhs), iVar5 != 0)) &&
      (iVar5 = std::__cxx11::string::compare((char *)__rhs), iVar5 != 0)) &&
     (((iVar5 = std::__cxx11::string::compare((char *)__rhs), iVar5 != 0 &&
       (iVar5 = std::__cxx11::string::compare((char *)__rhs), iVar5 != 0)) &&
      (iVar5 = std::__cxx11::string::compare((char *)__rhs), iVar5 != 0)))) {
    std::operator+(&local_98,"sub-command COMPARE does not recognize mode ",__rhs);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_50.field_2._M_allocated_capacity = local_98.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) {
      return false;
    }
    goto LAB_004abe7b;
  }
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x81) {
    local_98._M_dataplus._M_p = (pointer)0x1a;
    local_98._M_string_length = 0x941dda;
    local_98.field_2._M_allocated_capacity = 0;
    local_78 = pbVar1[1]._M_dataplus._M_p;
    local_98.field_2._8_8_ = pbVar1[1]._M_string_length;
    local_70 = 0;
    local_68 = 0x2d;
    local_60 = " needs at least 5 arguments total to command.";
    local_58 = 0;
    views._M_len = 3;
    views._M_array = (iterator)&local_98;
    cmCatViews(&local_50,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return false;
    }
    goto LAB_004abe7b;
  }
  __lhs = pbVar2 + 2;
  iVar5 = std::__cxx11::string::compare((char *)__rhs);
  if (iVar5 == 0) {
    iVar5 = std::__cxx11::string::compare((string *)__lhs);
    if (-1 < iVar5) goto LAB_004abf1c;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar5 == 0) {
      iVar5 = std::__cxx11::string::compare((string *)__lhs);
      if (0 < iVar5) goto LAB_004abf1c;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar5 == 0) {
        iVar5 = std::__cxx11::string::compare((string *)__lhs);
        if (iVar5 < 1) goto LAB_004abf1c;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar5 == 0) {
          bVar4 = std::operator>=(__lhs,pbVar2 + 3);
          if (!bVar4) goto LAB_004abf1c;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)__rhs);
          _Var3 = std::operator==(__lhs,pbVar2 + 3);
          if (_Var3 != (iVar5 == 0)) {
LAB_004abf1c:
            this = status->Makefile;
            pcVar6 = "0";
            goto LAB_004abf52;
          }
        }
      }
    }
  }
  this = status->Makefile;
  pcVar6 = "1";
LAB_004abf52:
  value._M_str = pcVar6;
  value._M_len = 1;
  cmMakefile::AddDefinition(this,pbVar2 + 4,value);
  return true;
}

Assistant:

bool HandleCompareCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() != 5) {
    status.SetError("COMPARE must be called with four arguments.");
    return false;
  }

  static std::map<cm::string_view,
                  std::function<bool(const cmCMakePath&,
                                     const cmCMakePath&)>> const operators{
    { "EQUAL"_s,
      [](const cmCMakePath& path1, const cmCMakePath& path2) -> bool {
        return path1 == path2;
      } },
    { "NOT_EQUAL"_s,
      [](const cmCMakePath& path1, const cmCMakePath& path2) -> bool {
        return path1 != path2;
      } }
  };

  const auto op = operators.find(args[2]);
  if (op == operators.end()) {
    status.SetError(cmStrCat(
      "COMPARE called with an unknown comparison operator: ", args[2], "."));
    return false;
  }

  if (args[4].empty()) {
    status.SetError("Invalid name for output variable.");
    return false;
  }

  cmCMakePath path1(args[1]);
  cmCMakePath path2(args[3]);
  auto result = op->second(path1, path2);

  status.GetMakefile().AddDefinitionBool(args[4], result);

  return true;
}